

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::binaryLogistic(Model *this,int32_t target,bool label,real lr)

{
  float a;
  undefined1 auVar1 [16];
  undefined7 in_register_00000011;
  int iVar2;
  long i;
  undefined1 auVar3 [16];
  real x;
  float fVar4;
  
  i = (long)target;
  x = Matrix::dotRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&this->hidden_,i);
  fVar4 = sigmoid(this,x);
  iVar2 = (int)CONCAT71(in_register_00000011,label);
  a = ((float)iVar2 - fVar4) * lr;
  Vector::addRow(&this->grad_,
                 (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,i,a);
  Matrix::addRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&this->hidden_,i,a);
  if (iVar2 == 0) {
    fVar4 = 1.0 - fVar4;
  }
  auVar3 = ZEXT816(0);
  if (fVar4 <= 1.0) {
    auVar3 = ZEXT416((uint)(this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)(fVar4 * 512.0)]);
  }
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar3,auVar1);
  return auVar3._0_4_;
}

Assistant:

real Model::binaryLogistic(int32_t target, bool label, real lr) {
	real score = sigmoid(wo_->dotRow(hidden_, target));
	real alpha = lr * (real(label) - score);
	grad_.addRow(*wo_, target, alpha);
	wo_->addRow(hidden_, target, alpha);
	if (label) {
		return -log(score);
	} else {
		return -log(1.0 - score);
	}
}